

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_log.cpp
# Opt level: O0

bool __thiscall Kumu::LogEntry::TestFilter(LogEntry *this,i32_t filter)

{
  i32_t filter_local;
  LogEntry *this_local;
  
  switch(this->Type) {
  case LOG_DEBUG:
    if ((filter & 1U) == 0) {
      return false;
    }
    break;
  case LOG_INFO:
    if ((filter & 2U) == 0) {
      return false;
    }
    break;
  case LOG_WARN:
    if ((filter & 4U) == 0) {
      return false;
    }
    break;
  case LOG_ERROR:
    if ((filter & 8U) == 0) {
      return false;
    }
    break;
  case LOG_NOTICE:
    if ((filter & 0x10U) == 0) {
      return false;
    }
    break;
  case LOG_ALERT:
    if ((filter & 0x20U) == 0) {
      return false;
    }
    break;
  case LOG_CRIT:
    if ((filter & 0x40U) == 0) {
      return false;
    }
    break;
  case LOG_MAX:
  }
  return true;
}

Assistant:

bool
Kumu::LogEntry::TestFilter(i32_t filter) const
{
  switch ( Type )
    {
    case LOG_CRIT:
      if ( (filter & LOG_ALLOW_CRIT) == 0 )
	return false;
      break;

    case LOG_ALERT:
      if ( (filter & LOG_ALLOW_ALERT) == 0 )
	return false;
      break;

    case LOG_NOTICE:
      if ( (filter & LOG_ALLOW_NOTICE) == 0 )
	return false;
      break;

    case LOG_ERROR:
      if ( (filter & LOG_ALLOW_ERROR) == 0 )
	return false;
      break;

    case LOG_WARN:
      if ( (filter & LOG_ALLOW_WARN) == 0 )
	return false;
      break;

    case LOG_INFO:
      if ( (filter & LOG_ALLOW_INFO) == 0 )
	return false;
      break;

    case LOG_DEBUG:
      if ( (filter & LOG_ALLOW_DEBUG) == 0 )
	return false;
      break;

    case LOG_MAX:
      break;
    }

 return true;
}